

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

void __thiscall
arangodb::velocypack::Builder::Builder
          (Builder *this,shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *buffer,
          Options *opts)

{
  Exception *this_00;
  shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> local_28;
  
  local_28.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (buffer->
         super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr;
  local_28.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (buffer->
       super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  (buffer->
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (buffer->
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)0x0;
  Builder(this,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.
              super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  if (opts != (Options *)0x0) {
    this->options = opts;
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,InternalError,"Options cannot be a nullptr");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

Builder::Builder(std::shared_ptr<Buffer<uint8_t>> buffer, Options const* opts)
    : Builder(std::move(buffer)) {
  if (VELOCYPACK_UNLIKELY(opts == nullptr)) {
    throw Exception(Exception::InternalError, "Options cannot be a nullptr");
  }
  options = opts;
}